

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O1

void icu_63::number::impl::blueprint_helpers::generateIncrementOption
               (double increment,int32_t trailingZeros,UnicodeString *sb,UErrorCode *param_4)

{
  DecimalQuantity dq;
  UnicodeString local_a8;
  DecimalQuantity local_68;
  
  DecimalQuantity::DecimalQuantity(&local_68);
  DecimalQuantity::setToDouble(&local_68,increment);
  DecimalQuantity::roundToInfinity(&local_68);
  DecimalQuantity::toPlainString(&local_a8,&local_68);
  if (-1 < local_a8.fUnion.fStackFields.fLengthAndFlags) {
    local_a8.fUnion.fFields.fLength = (int)local_a8.fUnion.fStackFields.fLengthAndFlags >> 5;
  }
  icu_63::UnicodeString::doAppend(sb,&local_a8,0,local_a8.fUnion.fFields.fLength);
  icu_63::UnicodeString::~UnicodeString(&local_a8);
  if (0 < trailingZeros) {
    do {
      icu_63::UnicodeString::append(sb,0x30);
      trailingZeros = trailingZeros + -1;
    } while (trailingZeros != 0);
  }
  DecimalQuantity::~DecimalQuantity(&local_68);
  return;
}

Assistant:

void blueprint_helpers::generateIncrementOption(double increment, int32_t trailingZeros, UnicodeString& sb,
                                                UErrorCode&) {
    // Utilize DecimalQuantity/double_conversion to format this for us.
    DecimalQuantity dq;
    dq.setToDouble(increment);
    dq.roundToInfinity();
    sb.append(dq.toPlainString());

    // We might need to append extra trailing zeros for min fraction...
    if (trailingZeros > 0) {
        appendMultiple(sb, u'0', trailingZeros);
    }
}